

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

void * __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this,size_t Size,
          size_t Alignment)

{
  ulong uVar1;
  void *pvVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  pair<void_*,_unsigned_long> local_40;
  
  if (Alignment == 0) {
    __assert_fail("Alignment > 0 && \"0-byte alignnment is not allowed. Use 1 instead.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Allocator.h"
                  ,0xd8,
                  "void *llvm::BumpPtrAllocatorImpl<>::Allocate(size_t, size_t) [AllocatorT = llvm::MallocAllocator, SlabSize = 4096, SizeThreshold = 4096]"
                 );
  }
  this->BytesAllocated = this->BytesAllocated + Size;
  uVar1 = Alignment - 1;
  if ((Alignment ^ uVar1) <= uVar1) {
    __assert_fail("Alignment && isPowerOf2_64((uint64_t)Alignment) && \"Alignment is not a power of two!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/MathExtras.h"
                  ,0x271,"uintptr_t llvm::alignAddr(const void *, size_t)");
  }
  pcVar4 = this->CurPtr;
  if (CARRY8(uVar1,(ulong)pcVar4)) goto LAB_001308a2;
  uVar5 = -Alignment;
  uVar3 = ((ulong)(pcVar4 + uVar1) & uVar5) - (long)pcVar4;
  if (CARRY8(uVar3,Size)) {
    __assert_fail("Adjustment + Size >= Size && \"Adjustment + Size must not overflow\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Allocator.h"
                  ,0xde,
                  "void *llvm::BumpPtrAllocatorImpl<>::Allocate(size_t, size_t) [AllocatorT = llvm::MallocAllocator, SlabSize = 4096, SizeThreshold = 4096]"
                 );
  }
  if ((ulong)((long)this->End - (long)pcVar4) < uVar3 + Size) {
    uVar3 = Size + uVar1;
    if (uVar3 < 0x1001) {
      StartNewSlab(this);
      if (CARRY8(uVar1,(ulong)this->CurPtr)) goto LAB_001308a2;
      pcVar4 = (char *)((ulong)(this->CurPtr + uVar1) & uVar5);
      if (this->End < pcVar4 + Size) {
        __assert_fail("AlignedAddr + SizeToAllocate <= (uintptr_t)End && \"Unable to allocate memory!\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Allocator.h"
                      ,0x108,
                      "void *llvm::BumpPtrAllocatorImpl<>::Allocate(size_t, size_t) [AllocatorT = llvm::MallocAllocator, SlabSize = 4096, SizeThreshold = 4096]"
                     );
      }
      this->CurPtr = pcVar4 + Size;
    }
    else {
      pvVar2 = malloc(uVar3);
      if (pvVar2 == (void *)0x0) {
        report_bad_alloc_error("Allocation failed",true);
      }
      local_40.first = pvVar2;
      local_40.second = uVar3;
      SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>::push_back
                ((SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true> *)
                 &this->CustomSizedSlabs,&local_40);
      if (CARRY8(uVar1,(ulong)pvVar2)) {
LAB_001308a2:
        __assert_fail("(uintptr_t)Addr + Alignment - 1 >= (uintptr_t)Addr",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/MathExtras.h"
                      ,0x273,"uintptr_t llvm::alignAddr(const void *, size_t)");
      }
      pcVar4 = (char *)(uVar1 + (long)pvVar2 & uVar5);
      if ((char *)(uVar3 + (long)pvVar2) < pcVar4 + Size) {
        __assert_fail("AlignedAddr + Size <= (uintptr_t)NewSlab + PaddedSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Allocator.h"
                      ,0xfd,
                      "void *llvm::BumpPtrAllocatorImpl<>::Allocate(size_t, size_t) [AllocatorT = llvm::MallocAllocator, SlabSize = 4096, SizeThreshold = 4096]"
                     );
      }
    }
  }
  else {
    pcVar4 = pcVar4 + uVar3;
    this->CurPtr = pcVar4 + Size;
  }
  return pcVar4;
}

Assistant:

void *
  Allocate(size_t Size, size_t Alignment) {
    assert(Alignment > 0 && "0-byte alignnment is not allowed. Use 1 instead.");

    // Keep track of how many bytes we've allocated.
    BytesAllocated += Size;

    size_t Adjustment = alignmentAdjustment(CurPtr, Alignment);
    assert(Adjustment + Size >= Size && "Adjustment + Size must not overflow");

    size_t SizeToAllocate = Size;
#if LLVM_ADDRESS_SANITIZER_BUILD
    // Add trailing bytes as a "red zone" under ASan.
    SizeToAllocate += RedZoneSize;
#endif

    // Check if we have enough space.
    if (Adjustment + SizeToAllocate <= size_t(End - CurPtr)) {
      char *AlignedPtr = CurPtr + Adjustment;
      CurPtr = AlignedPtr + SizeToAllocate;
      // Update the allocation point of this memory block in MemorySanitizer.
      // Without this, MemorySanitizer messages for values originated from here
      // will point to the allocation of the entire slab.
      __msan_allocated_memory(AlignedPtr, Size);
      // Similarly, tell ASan about this space.
      __asan_unpoison_memory_region(AlignedPtr, Size);
      return AlignedPtr;
    }

    // If Size is really big, allocate a separate slab for it.
    size_t PaddedSize = SizeToAllocate + Alignment - 1;
    if (PaddedSize > SizeThreshold) {
      void *NewSlab = Allocator.Allocate(PaddedSize, 0);
      // We own the new slab and don't want anyone reading anyting other than
      // pieces returned from this method.  So poison the whole slab.
      __asan_poison_memory_region(NewSlab, PaddedSize);
      CustomSizedSlabs.push_back(std::make_pair(NewSlab, PaddedSize));

      uintptr_t AlignedAddr = alignAddr(NewSlab, Alignment);
      assert(AlignedAddr + Size <= (uintptr_t)NewSlab + PaddedSize);
      char *AlignedPtr = (char*)AlignedAddr;
      __msan_allocated_memory(AlignedPtr, Size);
      __asan_unpoison_memory_region(AlignedPtr, Size);
      return AlignedPtr;
    }

    // Otherwise, start a new slab and try again.
    StartNewSlab();
    uintptr_t AlignedAddr = alignAddr(CurPtr, Alignment);
    assert(AlignedAddr + SizeToAllocate <= (uintptr_t)End &&
           "Unable to allocate memory!");
    char *AlignedPtr = (char*)AlignedAddr;
    CurPtr = AlignedPtr + SizeToAllocate;
    __msan_allocated_memory(AlignedPtr, Size);
    __asan_unpoison_memory_region(AlignedPtr, Size);
    return AlignedPtr;
  }